

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ct_log.c
# Opt level: O0

int ctlog_store_load_log(char *log_name,int log_name_len,void *arg)

{
  int iVar1;
  CONF *conf;
  OPENSSL_STACK *st;
  CTLOG_STORE *in_RDX;
  long in_RDI;
  int ret;
  char *tmp;
  CTLOG *ct_log;
  CTLOG_STORE_LOAD_CTX *load_ctx;
  undefined4 in_stack_ffffffffffffffc0;
  int iVar2;
  char *in_stack_ffffffffffffffc8;
  CTLOG *ptr;
  
  ptr = (CTLOG *)0x0;
  iVar2 = 0;
  if (in_RDI == 0) {
    return 1;
  }
  conf = (CONF *)CRYPTO_strndup((char *)in_RDX,0,in_stack_ffffffffffffffc8,0);
  if (conf != (CONF *)0x0) {
    iVar2 = ctlog_new_from_conf(in_RDX,(CTLOG **)ptr,conf,
                                (char *)CONCAT44(iVar2,in_stack_ffffffffffffffc0));
    CRYPTO_free(conf);
    if (iVar2 < 0) {
      return iVar2;
    }
    if (iVar2 == 0) {
      in_RDX->logs = in_RDX->logs + 1;
      return 1;
    }
    st = ossl_check_CTLOG_sk_type((stack_st_CTLOG *)(in_RDX->libctx->data).sk);
    ossl_check_CTLOG_type(ptr);
    iVar1 = OPENSSL_sk_push(st,(void *)0x4ddccd);
    if (iVar1 != 0) {
      return 1;
    }
  }
  iVar1 = (int)((ulong)conf >> 0x20);
  CTLOG_free((CTLOG *)0x4ddce8);
  ERR_new();
  ERR_set_debug((char *)ptr,iVar1,(char *)CONCAT44(iVar2,in_stack_ffffffffffffffc0));
  ERR_set_error(0x32,0xc0100,(char *)0x0);
  return -1;
}

Assistant:

static int ctlog_store_load_log(const char *log_name, int log_name_len,
                                void *arg)
{
    CTLOG_STORE_LOAD_CTX *load_ctx = arg;
    CTLOG *ct_log = NULL;
    /* log_name may not be null-terminated, so fix that before using it */
    char *tmp;
    int ret = 0;

    /* log_name will be NULL for empty list entries */
    if (log_name == NULL)
        return 1;

    tmp = OPENSSL_strndup(log_name, log_name_len);
    if (tmp == NULL)
        goto mem_err;

    ret = ctlog_new_from_conf(load_ctx->log_store, &ct_log, load_ctx->conf, tmp);
    OPENSSL_free(tmp);

    if (ret < 0) {
        /* Propagate any internal error */
        return ret;
    }
    if (ret == 0) {
        /* If we can't load this log, record that fact and skip it */
        ++load_ctx->invalid_log_entries;
        return 1;
    }

    if (!sk_CTLOG_push(load_ctx->log_store->logs, ct_log)) {
        goto mem_err;
    }
    return 1;

mem_err:
    CTLOG_free(ct_log);
    ERR_raise(ERR_LIB_CT, ERR_R_MALLOC_FAILURE);
    return -1;
}